

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blk_sse_sum.c
# Opt level: O3

void aom_get_blk_sse_sum_c(int16_t *data,int stride,int bw,int bh,int *x_sum,int64_t *x2_sum)

{
  int iVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  
  *x_sum = 0;
  *x2_sum = 0;
  if (0 < bh) {
    lVar2 = 0;
    iVar3 = 0;
    iVar1 = 0;
    do {
      if (0 < bw) {
        uVar4 = 0;
        do {
          iVar5 = (int)data[uVar4];
          iVar3 = iVar3 + iVar5;
          lVar2 = lVar2 + (ulong)(uint)(iVar5 * iVar5);
          uVar4 = uVar4 + 1;
        } while ((uint)bw != uVar4);
        *x_sum = iVar3;
        *x2_sum = lVar2;
      }
      iVar1 = iVar1 + 1;
      data = data + stride;
    } while (iVar1 != bh);
  }
  return;
}

Assistant:

void aom_get_blk_sse_sum_c(const int16_t *data, int stride, int bw, int bh,
                           int *x_sum, int64_t *x2_sum) {
  *x_sum = 0;
  *x2_sum = 0;
  for (int i = 0; i < bh; ++i) {
    for (int j = 0; j < bw; ++j) {
      const int val = data[j];
      *x_sum += val;
      *x2_sum += val * val;
    }
    data += stride;
  }
}